

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

void busy_msleep(unsigned_long msec)

{
  unsigned_long j;
  mbedtls_timing_hr_time hires;
  timeval local_50;
  timeval local_40 [2];
  
  gettimeofday(local_40,(__timezone_ptr_t)0x0);
  do {
    gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  } while ((ulong)((local_50.tv_usec - local_40[0].tv_usec) / 1000 +
                  (local_50.tv_sec - local_40[0].tv_sec) * 1000) < msec);
  return;
}

Assistant:

static void busy_msleep( unsigned long msec )
{
    struct mbedtls_timing_hr_time hires;
    unsigned long i = 0; /* for busy-waiting */
    volatile unsigned long j; /* to prevent optimisation */

    (void) mbedtls_timing_get_timer( &hires, 1 );

    while( mbedtls_timing_get_timer( &hires, 0 ) < msec )
        i++;

    j = i;
    (void) j;
}